

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::end_document
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,error_code *ec)

{
  int iVar1;
  size_type sVar2;
  undefined8 uVar3;
  reference pvVar4;
  long in_RDI;
  size_t pos;
  string *in_stack_ffffffffffffff78;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
  *in_stack_ffffffffffffff80;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *this_00;
  size_t sVar5;
  error_code *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  sVar2 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
          size((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
               (in_RDI + 0x98));
  if (sVar2 < 2) {
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar6));
    assertion_error::assertion_error
              ((assertion_error *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __cxa_throw(uVar3,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  basic_json_visitor<char>::end_object
            ((basic_json_visitor<char> *)in_stack_ffffffffffffff80,
             (ser_context *)in_stack_ffffffffffffff78,(error_code *)0x1ee296);
  *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
  iVar1 = level((basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *)0x1ee2aa);
  if (iVar1 == *(int *)(in_RDI + 0xc)) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  pvVar4 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
           back(in_stack_ffffffffffffff80);
  sVar5 = pvVar4->pos;
  pvVar4 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
           back(in_stack_ffffffffffffff80);
  if (sVar5 == pvVar4->length) {
    pvVar4 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ::back(in_stack_ffffffffffffff80);
    this_00 = (vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
              pvVar4->pos;
    std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::pop_back
              ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
               0x1ee346);
    pvVar4 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ::back(this_00);
    pvVar4->pos = (long)&(this_00->
                         super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                         )._M_impl.super__Vector_impl_data._M_start + pvVar4->pos;
  }
  else {
    std::error_code::operator=(in_stack_ffffffffffffff90,(bson_errc)(sVar5 >> 0x20));
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  return;
}

Assistant:

void end_document(json_visitor& visitor, std::error_code& ec)
    {
        JSONCONS_ASSERT(state_stack_.size() >= 2);

        visitor.end_object(*this,ec);
        more_ = !cursor_mode_;
        if (level() == mark_level_)
        {
            more_ = false;
        }
        if (JSONCONS_UNLIKELY(state_stack_.back().pos != state_stack_.back().length))
        {
            ec = bson_errc::size_mismatch;
            more_ = false;
            return;
        }
        std::size_t pos = state_stack_.back().pos;
        state_stack_.pop_back();
        state_stack_.back().pos += pos;
    }